

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testutil.h
# Opt level: O2

int test_layer<ncnn::Dropout>
              (int typeindex,ParamDict *pd,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *weights,
              Option *_opt,Mat *a,Mat *top_shape,float epsilon,_func_void_Dropout_ptr *func)

{
  undefined8 uVar1;
  int iVar2;
  Dropout *this;
  Option *pOVar3;
  Mat *__arg;
  Option opt;
  Mat c;
  Mat a_bf16;
  Mat a4;
  ModelBinFromMatArray mb;
  Mat b;
  
  pOVar3 = _opt;
  __arg = a;
  this = (Dropout *)ncnn::create_layer(typeindex);
  iVar2 = (int)pOVar3;
  opt.use_int8_arithmetic = _opt->use_int8_arithmetic;
  opt.use_packing_layout = _opt->use_packing_layout;
  opt.use_shader_pack8 = _opt->use_shader_pack8;
  opt.use_bf16_storage = _opt->use_bf16_storage;
  opt._36_4_ = *(undefined4 *)&_opt->field_0x24;
  opt.lightmode = _opt->lightmode;
  opt._1_3_ = *(undefined3 *)&_opt->field_0x1;
  opt.num_threads = _opt->num_threads;
  opt.blob_allocator = _opt->blob_allocator;
  opt.workspace_allocator = _opt->workspace_allocator;
  opt.use_winograd_convolution = _opt->use_winograd_convolution;
  opt.use_sgemm_convolution = _opt->use_sgemm_convolution;
  opt.use_int8_inference = _opt->use_int8_inference;
  opt.use_vulkan_compute = _opt->use_vulkan_compute;
  opt.use_fp16_packed = _opt->use_fp16_packed;
  opt.use_fp16_storage = _opt->use_fp16_storage;
  opt.use_fp16_arithmetic = _opt->use_fp16_arithmetic;
  opt.use_int8_storage = _opt->use_int8_storage;
  if (func != (_func_void_Dropout_ptr *)0x0) {
    (*func)(this);
  }
  if ((this->super_Layer).support_vulkan == false) {
    opt.use_vulkan_compute = false;
  }
  if ((this->super_Layer).support_packing == false) {
    opt.use_packing_layout = false;
  }
  if ((this->super_Layer).support_bf16_storage == false) {
    opt.use_bf16_storage = false;
  }
  uVar1 = opt._32_8_;
  if (opt.use_int8_inference == true) {
    opt.use_bf16_storage = false;
    opt.use_int8_arithmetic = SUB81(uVar1,0);
    opt.use_packing_layout = false;
  }
  if (top_shape->dims != 0) {
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize(&(this->super_Layer).bottom_shapes,1)
    ;
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize(&(this->super_Layer).top_shapes,1);
    ncnn::Mat::operator=
              ((this->super_Layer).bottom_shapes.
               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
               super__Vector_impl_data._M_start,a);
    ncnn::Mat::operator=
              ((this->super_Layer).top_shapes.
               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
               super__Vector_impl_data._M_start,top_shape);
  }
  (*(this->super_Layer)._vptr_Layer[2])(this,pd);
  ncnn::ModelBinFromMatArray::ModelBinFromMatArray
            (&mb,(weights->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start);
  (*(this->super_Layer)._vptr_Layer[3])(this,&mb);
  (*(this->super_Layer)._vptr_Layer[4])(this,&opt);
  b.elemsize._0_4_ = 0;
  b._20_8_ = 0;
  b.data = (void *)0x0;
  b.refcount._0_4_ = 0;
  b.refcount._4_4_ = 0;
  b.allocator = (Allocator *)0x0;
  b.dims = 0;
  b.w = 0;
  b.h = 0;
  b.c = 0;
  b.cstep = 0;
  if ((this->super_Layer).support_inplace == true) {
    ncnn::Mat::clone(&c,(__fn *)a,(void *)0x0,iVar2,__arg);
    ncnn::Mat::operator=(&b,&c);
    ncnn::Mat::~Mat(&c);
    ncnn::Dropout::forward_inplace(this,&b,&opt);
  }
  else {
    pOVar3 = &opt;
    ncnn::Layer::forward((Layer *)this,a,&b,pOVar3);
    iVar2 = (int)pOVar3;
  }
  c.elemsize._0_4_ = 0;
  c._20_8_ = 0;
  c.data = (void *)0x0;
  c.refcount._0_4_ = 0;
  c.refcount._4_4_ = 0;
  c.allocator = (Allocator *)0x0;
  c.dims = 0;
  c.w = 0;
  c.h = 0;
  c.c = 0;
  c.cstep = 0;
  a4.elemsize._0_4_ = 0;
  a4._20_8_ = 0;
  a4.data = (void *)0x0;
  a4.refcount._0_4_ = 0;
  a4.refcount._4_4_ = 0;
  a4.allocator = (Allocator *)0x0;
  a4.dims = 0;
  a4.w = 0;
  a4.h = 0;
  a4.c = 0;
  a4.cstep = 0;
  if (opt.use_packing_layout == true) {
    pOVar3 = &opt;
    ncnn::convert_packing(a,&a4,4,pOVar3);
    iVar2 = (int)pOVar3;
  }
  else {
    ncnn::Mat::operator=(&a4,a);
  }
  if (opt.use_bf16_storage == true) {
    a_bf16.elemsize._0_4_ = 0;
    a_bf16._20_8_ = 0;
    a_bf16.data = (void *)0x0;
    a_bf16.refcount._0_4_ = 0;
    a_bf16.refcount._4_4_ = 0;
    a_bf16.allocator = (Allocator *)0x0;
    a_bf16.dims = 0;
    a_bf16.w = 0;
    a_bf16.h = 0;
    a_bf16.c = 0;
    a_bf16.cstep = 0;
    ncnn::cast_float32_to_bfloat16(&a4,&a_bf16,&opt);
    ncnn::Mat::operator=(&a4,&a_bf16);
    ncnn::Mat::~Mat(&a_bf16);
  }
  if ((this->super_Layer).support_inplace == true) {
    ncnn::Mat::clone(&a_bf16,(__fn *)&a4,(void *)0x0,iVar2,__arg);
    ncnn::Mat::operator=(&c,&a_bf16);
    ncnn::Mat::~Mat(&a_bf16);
    (*(this->super_Layer)._vptr_Layer[9])(this,&c,&opt);
  }
  else {
    (*(this->super_Layer)._vptr_Layer[7])(this,&a4,&c,&opt);
  }
  if (opt.use_bf16_storage == true) {
    a_bf16.elemsize._0_4_ = 0;
    a_bf16._20_8_ = 0;
    a_bf16.data = (void *)0x0;
    a_bf16.refcount._0_4_ = 0;
    a_bf16.refcount._4_4_ = 0;
    a_bf16.allocator = (Allocator *)0x0;
    a_bf16.dims = 0;
    a_bf16.w = 0;
    a_bf16.h = 0;
    a_bf16.c = 0;
    a_bf16.cstep = 0;
    ncnn::cast_bfloat16_to_float32(&c,&a_bf16,&opt);
    ncnn::Mat::operator=(&c,&a_bf16);
    ncnn::Mat::~Mat(&a_bf16);
  }
  ncnn::Mat::~Mat(&a4);
  (*(this->super_Layer)._vptr_Layer[5])(this,&opt);
  (*(this->super_Layer)._vptr_Layer[1])(this);
  iVar2 = CompareMat(&b,&c,epsilon);
  if (iVar2 == 0) {
    iVar2 = 0;
    if (top_shape->dims == 0) {
      iVar2 = test_layer<ncnn::Dropout>(typeindex,pd,weights,&opt,a,&b,epsilon,func);
    }
  }
  else {
    fwrite("test_layer failed cpu\n",0x16,1,_stderr);
    iVar2 = -1;
  }
  ncnn::Mat::~Mat(&c);
  ncnn::Mat::~Mat(&b);
  ncnn::ModelBin::~ModelBin(&mb.super_ModelBin);
  return iVar2;
}

Assistant:

int test_layer(int typeindex, const ncnn::ParamDict& pd, const std::vector<ncnn::Mat>& weights, const ncnn::Option& _opt, const ncnn::Mat& a, const ncnn::Mat& top_shape = ncnn::Mat(), float epsilon = 0.001, void (*func)(T*) = 0)
{
    ncnn::Layer* op = ncnn::create_layer(typeindex);
    ncnn::Option opt = _opt;

    if (func)
    {
        (*func)((T*)op);
    }

    if (!op->support_vulkan) opt.use_vulkan_compute = false;
    if (!op->support_packing) opt.use_packing_layout = false;
    if (!op->support_bf16_storage) opt.use_bf16_storage = false;

    if (opt.use_int8_inference) opt.use_bf16_storage = false;
    if (opt.use_int8_inference) opt.use_packing_layout = false;

#if NCNN_VULKAN
    ncnn::VulkanDevice* vkdev = ncnn::get_gpu_device();

    ncnn::VkWeightBufferAllocator g_weight_vkallocator(vkdev);
    ncnn::VkWeightStagingBufferAllocator g_weight_staging_vkallocator(vkdev);

    ncnn::VkAllocator* blob_vkallocator = vkdev->acquire_blob_allocator();
    ncnn::VkAllocator* staging_vkallocator = vkdev->acquire_staging_allocator();

    opt.blob_vkallocator = blob_vkallocator;
    opt.workspace_vkallocator = blob_vkallocator;
    opt.staging_vkallocator = staging_vkallocator;

    if (!vkdev->info.support_fp16_storage) opt.use_fp16_storage = false;
    if (!vkdev->info.support_fp16_packed) opt.use_fp16_packed = false;

    op->vkdev = vkdev;
#endif // NCNN_VULKAN

    if (top_shape.dims)
    {
        op->bottom_shapes.resize(1);
        op->top_shapes.resize(1);
        op->bottom_shapes[0] = a;
        op->top_shapes[0] = top_shape;
    }

    op->load_param(pd);

    ncnn::ModelBinFromMatArray mb(weights.data());

    op->load_model(mb);

    op->create_pipeline(opt);

#if NCNN_VULKAN
    if (opt.use_vulkan_compute)
    {
        ncnn::VkTransfer cmd(vkdev);

        ncnn::Option opt_upload = opt;
        opt_upload.blob_vkallocator = &g_weight_vkallocator;
        opt_upload.workspace_vkallocator = &g_weight_vkallocator;
        opt_upload.staging_vkallocator = &g_weight_staging_vkallocator;

        op->upload_model(cmd, opt_upload);

        cmd.submit_and_wait();
    }
#endif // NCNN_VULKAN

    ncnn::Mat b;
    if (op->support_inplace)
    {
        b = a.clone();
        ((T*)op)->T::forward_inplace(b, opt);
    }
    else
    {
        ((T*)op)->T::forward(a, b, opt);
    }

    ncnn::Mat c;
    {
        ncnn::Mat a4;
        if (opt.use_packing_layout)
        {
            ncnn::convert_packing(a, a4, 4, opt);
        }
        else
        {
            a4 = a;
        }

        if (opt.use_bf16_storage)
        {
            ncnn::Mat a_bf16;
            ncnn::cast_float32_to_bfloat16(a4, a_bf16, opt);
            a4 = a_bf16;
        }

        if (op->support_inplace)
        {
            c = a4.clone();
            op->forward_inplace(c, opt);
        }
        else
        {
            op->forward(a4, c, opt);
        }

        if (opt.use_bf16_storage)
        {
            ncnn::Mat c_fp32;
            ncnn::cast_bfloat16_to_float32(c, c_fp32, opt);
            c = c_fp32;
        }
    }

#if NCNN_VULKAN
    ncnn::Mat d;
    if (opt.use_vulkan_compute)
    {
        // pack
        ncnn::Mat a4;
        if (opt.use_shader_pack8)
        {
            ncnn::convert_packing(a, a4, 8, opt);
            if (a4.elempack != 8)
                ncnn::convert_packing(a, a4, 4, opt);
        }
        else
            ncnn::convert_packing(a, a4, 4, opt);

        // fp16
        ncnn::Mat a4_fp16;
        if (opt.use_fp16_storage || ((a4.elempack == 4 || a4.elempack == 8) && opt.use_fp16_packed))
        {
            ncnn::cast_float32_to_float16(a4, a4_fp16, opt);
        }
        else
        {
            a4_fp16 = a4;
        }

        // forward
        ncnn::VkCompute cmd(vkdev);

        // upload
        ncnn::VkMat a4_fp16_gpu;
        cmd.record_upload(a4_fp16, a4_fp16_gpu, opt);

        ncnn::VkMat d4_fp16_gpu;
        if (op->support_inplace)
        {
            op->forward_inplace(a4_fp16_gpu, cmd, opt);

            d4_fp16_gpu = a4_fp16_gpu;
        }
        else
        {
            op->forward(a4_fp16_gpu, d4_fp16_gpu, cmd, opt);
        }

        // download
        cmd.record_download(d4_fp16_gpu, d, opt);

        cmd.submit_and_wait();
    }
#endif // NCNN_VULKAN

    op->destroy_pipeline(opt);

    delete op;

#if NCNN_VULKAN
    vkdev->reclaim_blob_allocator(blob_vkallocator);
    vkdev->reclaim_staging_allocator(staging_vkallocator);
    g_weight_vkallocator.clear();
    g_weight_staging_vkallocator.clear();
#endif // NCNN_VULKAN

    if (CompareMat(b, c, epsilon) != 0)
    {
        fprintf(stderr, "test_layer failed cpu\n");
        return -1;
    }

#if NCNN_VULKAN
    if (opt.use_vulkan_compute && CompareMat(b, d, epsilon) != 0)
    {
        fprintf(stderr, "test_layer failed gpu\n");
        return -1;
    }
#endif // NCNN_VULKAN

    if (top_shape.dims == 0)
        return test_layer<T>(typeindex, pd, weights, opt, a, b, epsilon, func);

    return 0;
}